

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double cosine_pdf(double x,double a,double b)

{
  double dVar1;
  
  dVar1 = 0.0;
  if ((b * -3.141592653589793 + a <= x) && (x <= b * 3.141592653589793 + a)) {
    dVar1 = cos((x - a) / b);
    dVar1 = dVar1 * (1.0 / (b * 6.283185307179586));
  }
  return dVar1;
}

Assistant:

double cosine_pdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    COSINE_PDF evaluates the Cosine PDF.
//
//  Discussion:
//
//    PDF(A,B;X) = ( 1 / ( 2 * PI * B ) ) * COS ( ( X - A ) / B )
//    for A - PI * B <= X <= A + PI * B
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < B.
//
//    Output, double PDF, the value of the PDF.
//
{
  double pdf = 0.0;
  const double r8_pi = 3.14159265358979323;
  double y;

  if ( x < a - r8_pi * b )
  {
    pdf = 0.0;
  }
  else if ( x <= a + r8_pi * b )
  {
    y = ( x - a ) / b;

    pdf = 1.0 / ( 2.0 * r8_pi * b ) * cos ( y );
  }
  else if ( a + r8_pi * b < x )
  {
    pdf = 0.0;
  }

  return pdf;
}